

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

int32 dict_word2basestr(char *word)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  
  sVar4 = strlen(word);
  iVar2 = (int)sVar4;
  if (2 < iVar2 && word[iVar2 + -1] == ')') {
    uVar3 = iVar2 - 2;
    do {
      if (word[uVar3] == '(') {
        word[uVar3] = '\0';
        return uVar3;
      }
      bVar1 = 1 < (int)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar1);
  }
  return -1;
}

Assistant:

int32
dict_word2basestr(char *word)
{
    int32 i, len;

    len = strlen(word);
    if (word[len - 1] == ')') {
        for (i = len - 2; (i > 0) && (word[i] != '('); --i);

        if (i > 0) {
            /* The word is of the form <baseword>(...); strip from left-paren */
            word[i] = '\0';
            return i;
        }
    }

    return -1;
}